

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O1

Type __thiscall UnifiedRegex::RegexPattern::EnsureTestCache(RegexPattern *this)

{
  char *addr;
  _func_int **pp_Var1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  Recycler *this_00;
  undefined4 *puVar5;
  char *pcVar6;
  long in_RSI;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  addr = (char *)(in_RSI + 8);
  if (*(long *)(in_RSI + 8) == 0) {
    local_50 = (undefined1  [8])&RegExpTestCache::typeinfo;
    data.typeinfo = (type_info *)0x40;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_a85219e;
    data.filename._0_4_ = 0x97;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (*(Recycler **)(*(long *)(in_RSI + 0x10) + 0x4e8),(TrackAllocData *)local_50
                        );
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00ef2ba4;
      *puVar5 = 0;
    }
    pcVar6 = Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                       (this_00,0x48);
    if (pcVar6 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00ef2ba4:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pcVar6[0] = '\0';
    pcVar6[1] = '\0';
    pcVar6[2] = '\0';
    pcVar6[3] = '\0';
    pcVar6[4] = '\0';
    pcVar6[5] = '\0';
    pcVar6[6] = '\0';
    pcVar6[7] = '\0';
    Memory::Recycler::WBSetBit(addr);
    *(char **)addr = pcVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  pp_Var1 = *(_func_int ***)addr;
  Memory::Recycler::WBSetBit((char *)this);
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       pp_Var1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  return (Type)(RegExpTestCache *)this;
}

Assistant:

RegexPattern::EnsureTestCache()
    {
        if (this->testCache == nullptr)
        {
            this->testCache = RecyclerNewPlusZ(this->library->GetRecycler(), TestCacheSize * sizeof(void*), RegExpTestCache);
        }
        return this->testCache;
    }